

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lzh_huffman_init(huffman_conflict *hf,size_t len_size,wchar_t tbl_bits)

{
  wchar_t wVar1;
  uchar *puVar2;
  uint16_t *puVar3;
  htree_t *phVar4;
  
  if (hf->bitlen == (uchar *)0x0) {
    puVar2 = (uchar *)malloc(len_size);
    hf->bitlen = puVar2;
    if (puVar2 != (uchar *)0x0) goto LAB_0014ae7b;
LAB_0014aec4:
    wVar1 = L'\xffffffe2';
  }
  else {
LAB_0014ae7b:
    if (hf->tbl == (uint16_t *)0x0) {
      puVar3 = (uint16_t *)malloc(0x800);
      hf->tbl = puVar3;
      if (puVar3 == (uint16_t *)0x0) goto LAB_0014aec4;
    }
    if (hf->tree == (htree_t *)0x0) {
      hf->tree_avail = L'Ѐ';
      phVar4 = (htree_t *)malloc(0x1000);
      hf->tree = phVar4;
      if (phVar4 == (htree_t *)0x0) goto LAB_0014aec4;
    }
    hf->len_size = (wchar_t)len_size;
    hf->tbl_bits = L'\x10';
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
lzh_huffman_init(struct huffman *hf, size_t len_size, int tbl_bits)
{
	int bits;

	if (hf->bitlen == NULL) {
		hf->bitlen = malloc(len_size * sizeof(hf->bitlen[0]));
		if (hf->bitlen == NULL)
			return (ARCHIVE_FATAL);
	}
	if (hf->tbl == NULL) {
		if (tbl_bits < HTBL_BITS)
			bits = tbl_bits;
		else
			bits = HTBL_BITS;
		hf->tbl = malloc(((size_t)1 << bits) * sizeof(hf->tbl[0]));
		if (hf->tbl == NULL)
			return (ARCHIVE_FATAL);
	}
	if (hf->tree == NULL && tbl_bits > HTBL_BITS) {
		hf->tree_avail = 1 << (tbl_bits - HTBL_BITS + 4);
		hf->tree = malloc(hf->tree_avail * sizeof(hf->tree[0]));
		if (hf->tree == NULL)
			return (ARCHIVE_FATAL);
	}
	hf->len_size = (int)len_size;
	hf->tbl_bits = tbl_bits;
	return (ARCHIVE_OK);
}